

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::init
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration> *this,
          EVP_PKEY_CTX *ctx)

{
  pointer *ppSVar1;
  deUint64 *pdVar2;
  int *piVar3;
  pointer __src;
  int iVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar5;
  ulong uVar6;
  pointer pSVar7;
  NotSupportedError *this_00;
  long *plVar8;
  size_type *psVar9;
  size_t __n;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int local_f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar4 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  lVar12 = CONCAT44(extraout_var,iVar4);
  RenderPerformanceTestBase::init(&this->super_RenderPerformanceTestBase,ctx);
  pRVar5 = Context::getRenderTarget
                     ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
  if (0x7f < pRVar5->m_width) {
    pRVar5 = Context::getRenderTarget
                       ((this->super_RenderPerformanceTestBase).super_TestCase.m_context);
    if (0x7f < pRVar5->m_height) {
      lVar11 = 0;
      (**(code **)(lVar12 + 0x1a00))(0,0,0x80,0x80);
      (**(code **)(lVar12 + 0x120))(0x302,0x303);
      (**(code **)(lVar12 + 0x100))(0x8006);
      (**(code **)(lVar12 + 0x5e0))(0xbe2);
      do {
        pSVar7 = (this->m_results).
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pSVar7 == (this->m_results).
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          __src = (this->m_results).
                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          __n = (long)pSVar7 - (long)__src;
          if (__n == 0x7ffffffffffffff8) {
            std::__throw_length_error("vector::_M_realloc_insert");
          }
          lVar12 = (long)__n >> 3;
          uVar13 = lVar12 * -0x71c71c71c71c71c7;
          uVar6 = uVar13;
          if (pSVar7 == __src) {
            uVar6 = 1;
          }
          uVar10 = uVar6 + uVar13;
          if (0x1c71c71c71c71c6 < uVar10) {
            uVar10 = 0x1c71c71c71c71c7;
          }
          if (CARRY8(uVar6,uVar13)) {
            uVar10 = 0x1c71c71c71c71c7;
          }
          if (uVar10 == 0) {
            pSVar7 = (pointer)0x0;
          }
          else {
            pSVar7 = (pointer)operator_new(uVar10 * 0x48);
          }
          pdVar2 = &(pSVar7->result).duration.renderReadDuration + lVar12;
          *pdVar2 = 0;
          pdVar2[1] = 0;
          pdVar2 = &(pSVar7->result).duration.renderDuration + lVar12;
          *pdVar2 = 0;
          pdVar2[1] = 0;
          piVar3 = &(pSVar7->result).uploadedDataSize + lVar12 * 2;
          *(undefined8 *)piVar3 = 0;
          *(undefined8 *)(piVar3 + 2) = 0;
          piVar3 = &(pSVar7->scene).gridWidth + lVar12 * 2;
          *(undefined8 *)piVar3 = 0;
          *(undefined8 *)(piVar3 + 2) = 0;
          (&(pSVar7->result).duration.fitResponseDuration)[lVar12] = 0;
          if (0 < (long)__n) {
            memmove(pSVar7,__src,__n);
          }
          if (__src != (pointer)0x0) {
            operator_delete(__src,(long)(this->m_results).
                                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__src);
          }
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_start = pSVar7;
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pSVar7 + __n + 0x48);
          (this->m_results).
          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar7 + uVar10;
        }
        else {
          (pSVar7->result).duration.renderReadDuration = 0;
          (pSVar7->result).duration.totalDuration = 0;
          (pSVar7->result).duration.renderDuration = 0;
          (pSVar7->result).duration.readDuration = 0;
          (pSVar7->result).uploadedDataSize = 0;
          (pSVar7->result).renderDataSize = 0;
          (pSVar7->result).unrelatedDataSize = 0;
          (pSVar7->result).numVertices = 0;
          (pSVar7->scene).gridWidth = 0;
          (pSVar7->scene).gridHeight = 0;
          *(undefined8 *)&(pSVar7->scene).gridLayers = 0;
          (pSVar7->result).duration.fitResponseDuration = 0;
          ppSVar1 = &(this->m_results).
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        iVar4 = *(int *)((long)&DAT_01c6c860 + lVar11);
        pSVar7 = (this->m_results).
                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pSVar7[-1].scene.gridHeight = iVar4;
        pSVar7[-1].scene.gridWidth = iVar4;
        pSVar7[-1].scene.gridLayers = 5;
        pSVar7[-1].result.numVertices = iVar4 * iVar4 * 0x1e;
        pSVar7[-1].result.uploadedDataSize = -1;
        pSVar7[-1].result.renderDataSize = -1;
        pSVar7[-1].result.unrelatedDataSize = -1;
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x4c);
      std::vector<int,_std::allocator<int>_>::resize
                (&this->m_iterationOrder,
                 ((long)(this->m_results).
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->m_results).
                        super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::SampleResult>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
      generateTwoPassRandomIterationOrder
                (&this->m_iterationOrder,
                 (int)((ulong)((long)(this->m_iterationOrder).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->m_iterationOrder).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 2));
      return extraout_EAX;
    }
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_f8[1] = 0x80;
  de::toString<int>(&local_90,local_f8 + 1);
  std::operator+(&local_70,"Test case requires ",&local_90);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_f0._M_dataplus._M_p = (pointer)*plVar8;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_f0._M_dataplus._M_p == psVar9) {
    local_f0.field_2._M_allocated_capacity = *psVar9;
    local_f0.field_2._8_8_ = plVar8[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *psVar9;
  }
  local_f0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_f8[0] = 0x80;
  de::toString<int>(&local_b0,local_f8);
  std::operator+(&local_50,&local_f0,&local_b0);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_d0._M_dataplus._M_p = (pointer)*plVar8;
  psVar9 = (size_type *)(plVar8 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar9) {
    local_d0.field_2._M_allocated_capacity = *psVar9;
    local_d0.field_2._8_8_ = plVar8[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar9;
  }
  local_d0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  tcu::NotSupportedError::NotSupportedError(this_00,&local_d0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void RenderCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	RenderPerformanceTestBase::init();

	// requirements

	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE ||
		m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test case requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " render target");

	// gl state

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);

	// enable bleding to prevent grid layers from being discarded
	gl.blendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);
	gl.blendEquation(GL_FUNC_ADD);
	gl.enable(GL_BLEND);

	// generate iterations

	{
		const int gridSizes[] = { 20, 26, 32, 38, 44, 50, 56, 62, 68, 74, 80,  86,  92,  98,  104, 110, 116, 122, 128 };

		for (int gridNdx = 0; gridNdx < DE_LENGTH_OF_ARRAY(gridSizes); ++gridNdx)
		{
			m_results.push_back(SampleResult());

			m_results.back().scene.gridHeight = gridSizes[gridNdx];
			m_results.back().scene.gridWidth = gridSizes[gridNdx];
			m_results.back().scene.gridLayers = 5;

			m_results.back().result.numVertices = getLayeredGridNumVertices(m_results.back().scene);

			// test cases set these, initialize to dummy values
			m_results.back().result.renderDataSize = -1;
			m_results.back().result.uploadedDataSize = -1;
			m_results.back().result.unrelatedDataSize = -1;
		}
	}

	// randomize iteration order
	{
		m_iterationOrder.resize(m_results.size());
		generateTwoPassRandomIterationOrder(m_iterationOrder, (int)m_iterationOrder.size());
	}
}